

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void doWarehouseStuff(IClientConnector *clientConnector)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  reference pPVar3;
  Product *p_1;
  iterator __end1;
  iterator __begin1;
  vector<Product,_std::allocator<Product>_> *__range1;
  vector<Product,_std::allocator<Product>_> all;
  JsonRpcException *e;
  string local_178;
  Product local_158;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  Product p2;
  Product p;
  WareHouseClient local_30;
  WareHouseClient appClient;
  JsonRpcClient client;
  IClientConnector *clientConnector_local;
  
  jsonrpccxx::JsonRpcClient::JsonRpcClient((JsonRpcClient *)&appClient,clientConnector,v2);
  WareHouseClient::WareHouseClient(&local_30,(JsonRpcClient *)&appClient);
  Product::Product((Product *)&p2.cat);
  std::__cxx11::string::operator=((string *)&p2.cat,"0xff");
  p.id.field_2._8_8_ = 0x4036666666666666;
  std::__cxx11::string::operator=((string *)&p.price,"Product 1");
  p.name.field_2._8_4_ = 1;
  poVar2 = std::operator<<((ostream *)&std::cout,"Adding product: ");
  this = (void *)std::ostream::operator<<(poVar2,std::boolalpha);
  bVar1 = WareHouseClient::AddProduct(&local_30,(Product *)&p2.cat);
  poVar2 = (ostream *)std::ostream::operator<<(this,bVar1);
  std::operator<<(poVar2,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"0xff",&local_101);
  WareHouseClient::GetProduct((Product *)local_e0,&local_30,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  poVar2 = std::operator<<((ostream *)&std::cout,"Found product: ");
  poVar2 = std::operator<<(poVar2,(string *)&p2.price);
  std::operator<<(poVar2,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"0xff2",(allocator<char> *)((long)&e + 7));
  WareHouseClient::GetProduct(&local_158,&local_30,&local_178);
  Product::~Product(&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  WareHouseClient::AllProducts((vector<Product,_std::allocator<Product>_> *)&__range1,&local_30);
  __end1 = std::vector<Product,_std::allocator<Product>_>::begin
                     ((vector<Product,_std::allocator<Product>_> *)&__range1);
  p_1 = (Product *)
        std::vector<Product,_std::allocator<Product>_>::end
                  ((vector<Product,_std::allocator<Product>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Product_*,_std::vector<Product,_std::allocator<Product>_>_>
                                *)&p_1);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<Product_*,_std::vector<Product,_std::allocator<Product>_>_>::
             operator*(&__end1);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&pPVar3->name);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<Product_*,_std::vector<Product,_std::allocator<Product>_>_>::
    operator++(&__end1);
  }
  std::vector<Product,_std::allocator<Product>_>::~vector
            ((vector<Product,_std::allocator<Product>_> *)&__range1);
  Product::~Product((Product *)local_e0);
  Product::~Product((Product *)&p2.cat);
  jsonrpccxx::JsonRpcClient::~JsonRpcClient((JsonRpcClient *)&appClient);
  return;
}

Assistant:

void doWarehouseStuff(IClientConnector &clientConnector) {
  JsonRpcClient client(clientConnector, version::v2);
  WareHouseClient appClient(client);
  Product p;
  p.id = "0xff";
  p.price = 22.4;
  p.name = "Product 1";
  p.cat = category::cash_carry;
  cout << "Adding product: " << std::boolalpha << appClient.AddProduct(p) << "\n";

  Product p2 = appClient.GetProduct("0xff");
  cout << "Found product: " << p2.name << "\n";
  try {
    appClient.GetProduct("0xff2");
  } catch (JsonRpcException &e) {
    cerr << "Error finding product: " << e.what() << "\n";
  }

  auto all = appClient.AllProducts();
  for (const auto &p: all) {
    cout << p.name << endl;
  }
}